

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O0

string * (anonymous_namespace)::input_name_abi_cxx11_(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *in_RDI;
  
  bVar1 = anon_unknown.dwarf_91eb::is_file_input();
  if (bVar1) {
    pbVar2 = pstore::command_line::
             opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                    *)json_source_abi_cxx11_);
    std::__cxx11::string::string(in_RDI,(string *)pbVar2);
  }
  else {
    s_abi_cxx11_(in_RDI,"stdin",5);
  }
  return in_RDI;
}

Assistant:

std::string input_name () { return is_file_input () ? json_source.get () : "stdin"s; }